

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int32 iVar1;
  int iVar2;
  cmd_ln_t *pcVar3;
  char *pcVar4;
  char **accum_dirs;
  long ln;
  err_lvl_t lvl;
  uint32 n_gau;
  uint32 n_feat;
  uint32 n_mixw;
  float32 ***mixw_acc_in;
  float32 ***mixw_acc_b;
  float32 ***mixw_acc_a;
  model_def_t *mdef;
  float32 ***mixw;
  uint32 local_68;
  uint32 local_64;
  uint32 local_60;
  uint32 local_5c;
  float32 ***local_58;
  float32 ***local_50;
  float32 ***local_48;
  model_def_t *local_40;
  float32 ***local_38;
  
  parse_cmd_ln(argc,argv);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-moddeffn");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "No moddeffn specified, exiting";
    ln = 0x21f;
    lvl = ERR_ERROR;
  }
  else {
    pcVar3 = cmd_ln_get();
    pcVar4 = cmd_ln_str_r(pcVar3,"-moddeffn");
    iVar1 = model_def_read(&local_40,pcVar4);
    if (iVar1 != 0) goto LAB_00103b31;
    local_5c = 0;
    pcVar3 = cmd_ln_get();
    accum_dirs = cmd_ln_str_list_r(pcVar3,"-accumdirs");
    if (*accum_dirs == (char *)0x0) {
      __assert_fail("accum_dir[i] != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                    ,0x22c,"int rd_interp_wr()");
    }
    rd_param(&local_5c,accum_dirs,&local_48,&local_60,&local_64,&local_68);
    if (accum_dirs[local_5c] == (char *)0x0) {
      __assert_fail("accum_dir[i] != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                    ,0x230,"int rd_interp_wr()");
    }
    rd_param(&local_5c,accum_dirs,&local_50,&local_60,&local_64,&local_68);
    if (accum_dirs[local_5c] != (char *)0x0) {
      do {
        rd_param(&local_5c,accum_dirs,&local_58,&local_60,&local_64,&local_68);
        if (local_58 != (float32 ***)0x0) {
          accum_3d(local_48,local_58,local_60,local_64,local_68);
        }
        ckd_free_3d(local_58);
        if (accum_dirs[local_5c] == (char *)0x0) {
          __assert_fail("accum_dir[i] != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
                        ,0x23f,"int rd_interp_wr()");
        }
        rd_param(&local_5c,accum_dirs,&local_58,&local_60,&local_64,&local_68);
        if (local_58 != (float32 ***)0x0) {
          accum_3d(local_50,local_58,local_60,local_64,local_68);
        }
        ckd_free_3d(local_58);
      } while (accum_dirs[local_5c] != (char *)0x0);
    }
    smooth_mixw(&local_38,local_48,local_50,local_60,local_64,local_68,local_40);
    iVar2 = wr_param(local_38,local_60,local_64,local_68);
    if (iVar2 == 0) {
      return 0;
    }
    pcVar4 = "Error writing parameters\n";
    ln = 0x255;
    lvl = ERR_FATAL;
  }
  err_msg(lvl,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/delint/main.c"
          ,ln,pcVar4);
LAB_00103b31:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    parse_cmd_ln(argc, argv);

    if (rd_interp_wr() != S3_SUCCESS)
	exit(1);
    
    return 0;
}